

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

ptr<Expression> __thiscall Parser::memberAccess(Parser *this,ptr<Expression> *callee)

{
  shared_ptr<Expression> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr<Expression> pVar1;
  shared_ptr<Expression> local_70 [2];
  undefined1 local_50 [40];
  ptr<Expression> expr;
  ptr<Expression> *callee_local;
  Parser *this_local;
  
  consume((Parser *)callee);
  variable((Parser *)local_50);
  make<MemberAccess,std::shared_ptr<Expression>&,std::shared_ptr<Expression>>
            ((shared_ptr<Expression> *)(local_50 + 0x10),in_RDX);
  std::shared_ptr<Expression>::shared_ptr<MemberAccess,void>
            ((shared_ptr<Expression> *)(local_50 + 0x20),
             (shared_ptr<MemberAccess> *)(local_50 + 0x10));
  std::shared_ptr<MemberAccess>::~shared_ptr((shared_ptr<MemberAccess> *)(local_50 + 0x10));
  std::shared_ptr<Expression>::~shared_ptr((shared_ptr<Expression> *)local_50);
  std::shared_ptr<Expression>::shared_ptr(local_70,(shared_ptr<Expression> *)(local_50 + 0x20));
  postfix(this,callee);
  std::shared_ptr<Expression>::~shared_ptr(local_70);
  std::shared_ptr<Expression>::~shared_ptr((shared_ptr<Expression> *)(local_50 + 0x20));
  pVar1.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar1.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Expression>)pVar1.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Expression> Parser::memberAccess(ptr<Expression> callee) {
    consume();
    ptr<Expression> expr = make<MemberAccess>(callee, variable());
    return postfix(expr);
}